

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall
IR::BranchInstr::ReplaceTarget
          (BranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  bool bVar1;
  MultiBranchInstr *this_00;
  
  bVar1 = IsMultiBranch(this);
  if (!bVar1) {
    bVar1 = this->m_branchTarget == oldLabelInstr;
    if (bVar1) {
      SetTarget(this,newLabelInstr);
    }
    return bVar1;
  }
  this_00 = AsMultiBrInstr(this);
  bVar1 = MultiBranchInstr::ReplaceTarget(this_00,oldLabelInstr,newLabelInstr);
  return bVar1;
}

Assistant:

bool
BranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    if (this->IsMultiBranch())
    {
        return this->AsMultiBrInstr()->ReplaceTarget(oldLabelInstr, newLabelInstr);
    }
    if (this->GetTarget() == oldLabelInstr)
    {
        this->SetTarget(newLabelInstr);
        return true;
    }
    return false;
}